

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_constant_names_generated.c
# Opt level: O0

char * psa_strerror(psa_status_t status)

{
  char *pcStack_10;
  psa_status_t status_local;
  
  switch(status) {
  case 0:
    pcStack_10 = "PSA_SUCCESS";
    break;
  case -0x97:
    pcStack_10 = "PSA_ERROR_CORRUPTION_DETECTED";
    break;
  case -0x96:
    pcStack_10 = "PSA_ERROR_INVALID_PADDING";
    break;
  case -0x95:
    pcStack_10 = "PSA_ERROR_INVALID_SIGNATURE";
    break;
  case -0x94:
    pcStack_10 = "PSA_ERROR_INSUFFICIENT_ENTROPY";
    break;
  case -0x93:
    pcStack_10 = "PSA_ERROR_HARDWARE_FAILURE";
    break;
  case -0x92:
    pcStack_10 = "PSA_ERROR_STORAGE_FAILURE";
    break;
  case -0x91:
    pcStack_10 = "PSA_ERROR_COMMUNICATION_FAILURE";
    break;
  default:
    pcStack_10 = (char *)0x0;
    break;
  case -0x8f:
    pcStack_10 = "PSA_ERROR_INSUFFICIENT_DATA";
    break;
  case -0x8e:
    pcStack_10 = "PSA_ERROR_INSUFFICIENT_STORAGE";
    break;
  case -0x8d:
    pcStack_10 = "PSA_ERROR_INSUFFICIENT_MEMORY";
    break;
  case -0x8c:
    pcStack_10 = "PSA_ERROR_DOES_NOT_EXIST";
    break;
  case -0x8b:
    pcStack_10 = "PSA_ERROR_ALREADY_EXISTS";
    break;
  case -0x8a:
    pcStack_10 = "PSA_ERROR_BUFFER_TOO_SMALL";
    break;
  case -0x89:
    pcStack_10 = "PSA_ERROR_BAD_STATE";
    break;
  case -0x88:
    pcStack_10 = "PSA_ERROR_INVALID_HANDLE";
    break;
  case -0x87:
    pcStack_10 = "PSA_ERROR_INVALID_ARGUMENT";
    break;
  case -0x86:
    pcStack_10 = "PSA_ERROR_NOT_SUPPORTED";
    break;
  case -0x85:
    pcStack_10 = "PSA_ERROR_NOT_PERMITTED";
    break;
  case -0x84:
    pcStack_10 = "PSA_ERROR_GENERIC_ERROR";
  }
  return pcStack_10;
}

Assistant:

static const char *psa_strerror(psa_status_t status)
{
    switch (status) {
    case PSA_ERROR_ALREADY_EXISTS: return "PSA_ERROR_ALREADY_EXISTS";
    case PSA_ERROR_BAD_STATE: return "PSA_ERROR_BAD_STATE";
    case PSA_ERROR_BUFFER_TOO_SMALL: return "PSA_ERROR_BUFFER_TOO_SMALL";
    case PSA_ERROR_COMMUNICATION_FAILURE: return "PSA_ERROR_COMMUNICATION_FAILURE";
    case PSA_ERROR_CORRUPTION_DETECTED: return "PSA_ERROR_CORRUPTION_DETECTED";
    case PSA_ERROR_DOES_NOT_EXIST: return "PSA_ERROR_DOES_NOT_EXIST";
    case PSA_ERROR_GENERIC_ERROR: return "PSA_ERROR_GENERIC_ERROR";
    case PSA_ERROR_HARDWARE_FAILURE: return "PSA_ERROR_HARDWARE_FAILURE";
    case PSA_ERROR_INSUFFICIENT_DATA: return "PSA_ERROR_INSUFFICIENT_DATA";
    case PSA_ERROR_INSUFFICIENT_ENTROPY: return "PSA_ERROR_INSUFFICIENT_ENTROPY";
    case PSA_ERROR_INSUFFICIENT_MEMORY: return "PSA_ERROR_INSUFFICIENT_MEMORY";
    case PSA_ERROR_INSUFFICIENT_STORAGE: return "PSA_ERROR_INSUFFICIENT_STORAGE";
    case PSA_ERROR_INVALID_ARGUMENT: return "PSA_ERROR_INVALID_ARGUMENT";
    case PSA_ERROR_INVALID_HANDLE: return "PSA_ERROR_INVALID_HANDLE";
    case PSA_ERROR_INVALID_PADDING: return "PSA_ERROR_INVALID_PADDING";
    case PSA_ERROR_INVALID_SIGNATURE: return "PSA_ERROR_INVALID_SIGNATURE";
    case PSA_ERROR_NOT_PERMITTED: return "PSA_ERROR_NOT_PERMITTED";
    case PSA_ERROR_NOT_SUPPORTED: return "PSA_ERROR_NOT_SUPPORTED";
    case PSA_ERROR_STORAGE_FAILURE: return "PSA_ERROR_STORAGE_FAILURE";
    case PSA_SUCCESS: return "PSA_SUCCESS";
    default: return NULL;
    }
}